

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_estimateCDictSize_advanced
                 (size_t dictSize,ZSTD_compressionParameters cParams,
                 ZSTD_dictLoadMethod_e dictLoadMethod)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  int in_ESI;
  U32 in_stack_00000074;
  U32 in_stack_00000078;
  ZSTD_paramSwitch_e in_stack_0000007c;
  ZSTD_compressionParameters *in_stack_00000080;
  ZSTD_compressionParameters *in_stack_ffffffffffffffc8;
  
  sVar1 = ZSTD_cwksp_alloc_size(0x17c0);
  sVar2 = ZSTD_cwksp_alloc_size(0x2200);
  lVar3 = sVar1 + sVar2;
  ZSTD_resolveRowMatchFinderMode((ZSTD_paramSwitch_e)sVar1,in_stack_ffffffffffffffc8);
  sVar2 = ZSTD_sizeof_matchState
                    (in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000074);
  if (in_ESI == 1) {
    sVar1 = 0;
  }
  else {
    sVar1 = ZSTD_cwksp_align(sVar1,(size_t)in_stack_ffffffffffffffc8);
    sVar1 = ZSTD_cwksp_alloc_size(sVar1);
  }
  return lVar3 + sVar2 + sVar1;
}

Assistant:

size_t ZSTD_estimateCDictSize_advanced(
        size_t dictSize, ZSTD_compressionParameters cParams,
        ZSTD_dictLoadMethod_e dictLoadMethod)
{
    DEBUGLOG(5, "sizeof(ZSTD_CDict) : %u", (unsigned)sizeof(ZSTD_CDict));
    return ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict))
         + ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE)
         /* enableDedicatedDictSearch == 1 ensures that CDict estimation will not be too small
          * in case we are using DDS with row-hash. */
         + ZSTD_sizeof_matchState(&cParams, ZSTD_resolveRowMatchFinderMode(ZSTD_ps_auto, &cParams),
                                  /* enableDedicatedDictSearch */ 1, /* forCCtx */ 0)
         + (dictLoadMethod == ZSTD_dlm_byRef ? 0
            : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void *))));
}